

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall QObjectPrivate::ConnectionData::removeConnection(ConnectionData *this,Connection *c)

{
  bool bVar1;
  Type this_00;
  ConnectionList *pCVar2;
  Type pQVar3;
  Type pCVar4;
  Connection *in_RSI;
  TaggedSignalVector *in_RDI;
  long in_FS_OFFSET;
  Connection *n;
  QThreadData *td;
  ConnectionList *connections;
  TaggedSignalVector o;
  Type in_stack_ffffffffffffff98;
  QThreadData *in_stack_ffffffffffffffa0;
  ConnectionList *in_stack_ffffffffffffffa8;
  memory_order __m;
  TaggedSignalVector __i;
  TaggedSignalVector local_20;
  anon_union_8_2_521c276c_for_ConnectionOrSignalVector_0 local_18;
  anon_union_8_2_521c276c_for_ConnectionOrSignalVector_0 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QBasicAtomicPointer<QObjectPrivate::SignalVector>::loadRelaxed
                      ((QBasicAtomicPointer<QObjectPrivate::SignalVector> *)0x3eaf02);
  pCVar2 = SignalVector::at(this_00,(*(int *)&in_RSI->field_0x54 << 5) >> 5);
  QBasicAtomicPointer<QObject>::storeRelaxed
            ((QBasicAtomicPointer<QObject> *)in_stack_ffffffffffffffa0,
             (Type)in_stack_ffffffffffffff98);
  pQVar3 = QBasicAtomicPointer<QThreadData>::loadRelaxed
                     ((QBasicAtomicPointer<QThreadData> *)0x3eaf3d);
  if (pQVar3 != (Type)0x0) {
    QThreadData::deref(in_stack_ffffffffffffffa0);
  }
  __m = (memory_order)((ulong)pQVar3 >> 0x20);
  QBasicAtomicPointer<QThreadData>::storeRelaxed
            ((QBasicAtomicPointer<QThreadData> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98
            );
  *(anon_union_8_2_521c276c_for_ConnectionOrSignalVector_0 *)in_RSI->prev =
       (in_RSI->super_ConnectionOrSignalVector).field_0;
  if ((in_RSI->super_ConnectionOrSignalVector).field_0.next != (Connection *)0x0) {
    ((in_RSI->super_ConnectionOrSignalVector).field_0.next)->prev = in_RSI->prev;
  }
  in_RSI->prev = (Connection **)0x0;
  pCVar4 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                     ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3eafb1);
  __i.c = (quintptr)pCVar2;
  if (pCVar4 == in_RSI) {
    QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
              ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3eafd0);
    QBasicAtomicPointer<QObjectPrivate::Connection>::storeRelaxed
              ((QBasicAtomicPointer<QObjectPrivate::Connection> *)in_stack_ffffffffffffffa0,
               (Type)in_stack_ffffffffffffff98);
    in_stack_ffffffffffffffa8 = pCVar2;
  }
  pCVar4 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                     ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3eafeb);
  if (pCVar4 == in_RSI) {
    QBasicAtomicPointer<QObjectPrivate::Connection>::storeRelaxed
              ((QBasicAtomicPointer<QObjectPrivate::Connection> *)in_stack_ffffffffffffffa0,
               (Type)in_stack_ffffffffffffff98);
  }
  pCVar4 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                     ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3eb017);
  if (pCVar4 != (Type)0x0) {
    pCVar4->prevConnectionList = in_RSI->prevConnectionList;
  }
  if (in_RSI->prevConnectionList != (Connection *)0x0) {
    QBasicAtomicPointer<QObjectPrivate::Connection>::storeRelaxed
              ((QBasicAtomicPointer<QObjectPrivate::Connection> *)in_stack_ffffffffffffffa0,
               (Type)in_stack_ffffffffffffff98);
  }
  in_RSI->prevConnectionList = (Connection *)0x0;
  local_10.next = (Connection *)&DAT_aaaaaaaaaaaaaaaa;
  TaggedSignalVector::TaggedSignalVector(&local_10.nextInOrphanList,(nullptr_t)0x0);
  local_18.nextInOrphanList =
       std::atomic<QObjectPrivate::TaggedSignalVector>::load
                 ((atomic<QObjectPrivate::TaggedSignalVector> *)__i.c,__m);
  local_10.nextInOrphanList.c = local_18.nextInOrphanList.c;
  do {
    (in_RSI->super_ConnectionOrSignalVector).field_0.nextInOrphanList.c = (quintptr)local_10;
    TaggedSignalVector::TaggedSignalVector(&local_20,in_RSI);
    bVar1 = std::atomic<QObjectPrivate::TaggedSignalVector>::compare_exchange_strong
                      ((atomic<QObjectPrivate::TaggedSignalVector> *)pCVar4,in_RDI,__i,
                       (memory_order)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QObjectPrivate::ConnectionData::removeConnection(QObjectPrivate::Connection *c)
{
    Q_ASSERT(c->receiver.loadRelaxed());
    ConnectionList &connections = signalVector.loadRelaxed()->at(c->signal_index);
    c->receiver.storeRelaxed(nullptr);
    QThreadData *td = c->receiverThreadData.loadRelaxed();
    if (td)
        td->deref();
    c->receiverThreadData.storeRelaxed(nullptr);

#ifndef QT_NO_DEBUG
    bool found = false;
    for (Connection *cc = connections.first.loadRelaxed(); cc; cc = cc->nextConnectionList.loadRelaxed()) {
        if (cc == c) {
            found = true;
            break;
        }
    }
    Q_ASSERT(found);
#endif

    // remove from the senders linked list
    *c->prev = c->next;
    if (c->next)
        c->next->prev = c->prev;
    c->prev = nullptr;

    if (connections.first.loadRelaxed() == c)
        connections.first.storeRelaxed(c->nextConnectionList.loadRelaxed());
    if (connections.last.loadRelaxed() == c)
        connections.last.storeRelaxed(c->prevConnectionList);
    Q_ASSERT(signalVector.loadRelaxed()->at(c->signal_index).first.loadRelaxed() != c);
    Q_ASSERT(signalVector.loadRelaxed()->at(c->signal_index).last.loadRelaxed() != c);

    // keep c->nextConnectionList intact, as it might still get accessed by activate
    Connection *n = c->nextConnectionList.loadRelaxed();
    if (n)
        n->prevConnectionList = c->prevConnectionList;
    if (c->prevConnectionList)
        c->prevConnectionList->nextConnectionList.storeRelaxed(n);
    c->prevConnectionList = nullptr;

    Q_ASSERT(c != static_cast<Connection *>(orphaned.load(std::memory_order_relaxed)));
    // add c to orphanedConnections
    TaggedSignalVector o = nullptr;
    /* No ABA issue here: When adding a node, we only care about the list head, it doesn't
     * matter if the tail changes.
     */
    o = orphaned.load(std::memory_order_acquire);
    do {
        c->nextInOrphanList = o;
    } while (!orphaned.compare_exchange_strong(o, TaggedSignalVector(c), std::memory_order_release));

#ifndef QT_NO_DEBUG
    found = false;
    for (Connection *cc = connections.first.loadRelaxed(); cc; cc = cc->nextConnectionList.loadRelaxed()) {
        if (cc == c) {
            found = true;
            break;
        }
    }
    Q_ASSERT(!found);
#endif

}